

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayerBuilder.cpp
# Opt level: O2

ILayer * __thiscall DenseLifLayerBuilder::Build(DenseLifLayerBuilder *this,LayerMeta *meta)

{
  ILayer *this_00;
  undefined1 local_50 [64];
  
  this_00 = (ILayer *)operator_new(0x160);
  LayerMeta::LayerMeta((LayerMeta *)local_50,meta);
  DenseLifLayer::DenseLifLayer((DenseLifLayer *)this_00,(LayerMeta *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return this_00;
}

Assistant:

ILayer *DenseLifLayerBuilder::Build( LayerMeta meta ) const
{
    return new DenseLifLayer( meta );
}